

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_frs_al(void)

{
  uint address;
  
  if ((m68ki_cpu.cpu_type != 1) && (m68ki_cpu.s_flag == 0)) {
    m68ki_exception_privilege_violation();
    return;
  }
  address = m68ki_read_imm_32();
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,
                    m68ki_cpu.n_flag >> 4 & 8 | m68ki_cpu.x_flag >> 4 & 0x10 |
                    (uint)(m68ki_cpu.not_z_flag == 0) << 2 | m68ki_cpu.v_flag >> 6 & 2 |
                    m68ki_cpu.c_flag >> 8 & 1 |
                    m68ki_cpu.s_flag << 0xb | m68ki_cpu.t1_flag | m68ki_cpu.t0_flag |
                    m68ki_cpu.m_flag << 0xb | m68ki_cpu.int_mask);
  return;
}

Assistant:

static void m68k_op_move_16_frs_al(void)
{
	if(CPU_TYPE_IS_000(CPU_TYPE) || FLAG_S)	/* NS990408 */
	{
		uint ea = EA_AL_16();
		m68ki_write_16(ea, m68ki_get_sr());
		return;
	}
	m68ki_exception_privilege_violation();
}